

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ht_spkitable.c
# Opt level: O3

void update_spki(spki_table *s,spki_record record,_Bool added)

{
  long lVar1;
  uint32_t uVar2;
  char cVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  uVar2 = record.asn;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  printf("%c ASN: %u\n",(ulong)((uint)!added * 2 + 0x2b));
  printf("SKI:  ");
  printf("%02x",(ulong)record.ski[0]);
  lVar4 = 1;
  do {
    putchar(0x3a);
    printf("%02x",(ulong)record.ski[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x14);
  cVar3 = '\0';
  printf("\n  ");
  printf("SPKI: ");
  lVar4 = 0;
  while( true ) {
    if ((lVar4 != 0) && ((byte)(((byte)(((uint)lVar4 & 0xff) / 5) & 0xf8) * '\x05' + cVar3) == '\0')
       ) {
      printf("\n\t");
    }
    printf("%02x",(ulong)record.spki[lVar4]);
    if (lVar4 == 0x5a) break;
    putchar(0x3a);
    lVar4 = lVar4 + 1;
    cVar3 = cVar3 + -1;
  }
  putchar(10);
  if (uVar2 == 1 && added) {
    __assert_fail("!added",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x250,
                  "void update_spki(struct spki_table *, const struct spki_record, const _Bool)");
  }
  if (uVar2 == 3) {
    if (!added) {
      __assert_fail("added",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                    ,0x254,
                    "void update_spki(struct spki_table *, const struct spki_record, const _Bool)");
    }
  }
  else if (uVar2 == 2) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ht_spkitable.c"
                  ,0x252,
                  "void update_spki(struct spki_table *, const struct spki_record, const _Bool)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void update_spki(struct spki_table *s __attribute__((unused)), const struct spki_record record, const bool added)
{
	printf("%c ASN: %u\n", (added ? '+' : '-'), record.asn);

	int i;
	int size = sizeof(record.ski);

	printf("SKI:  ");
	for (i = 0; i < size; i++) {
		printf("%02x", record.ski[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n  ");

	i = 0;
	size = sizeof(record.spki);
	printf("SPKI: ");
	for (i = 0; i < size; i++) {
		if ((i % 40 == 0) && (i != 0))
			printf("\n	");

		printf("%02x", record.spki[i]);
		if (i < size - 1)
			printf(":");
	}
	printf("\n");

	if (record.asn == 1)
		assert(!added);
	if (record.asn == 2)
		assert(false);
	if (record.asn == 3)
		assert(added);
}